

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

BranchInst * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::BranchInst,LLVMBC::BasicBlock*&>
          (LLVMContext *this,BasicBlock **u)

{
  BranchInst *this_00;
  BranchInst *t;
  BranchInst *mem;
  BasicBlock **u_local;
  LLVMContext *this_local;
  
  this_00 = (BranchInst *)allocate(this,0x90,8);
  if (this_00 == (BranchInst *)0x0) {
    std::terminate();
  }
  BranchInst::BranchInst(this_00,*u);
  append_typed_destructor<LLVMBC::BranchInst>(this,this_00);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}